

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sine.cpp
# Opt level: O1

void __thiscall NaSineFunc::NaSineFunc(NaSineFunc *this,char *szOptions,NaVector *vInit)

{
  double dVar1;
  int iVar2;
  char *__nptr;
  char *szRest;
  char *szO;
  char *szP;
  char *szF;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  NaExternFunc::NaExternFunc(&this->super_NaExternFunc);
  *(undefined ***)this = &PTR_PrintLog_00103d30;
  this->bTime = false;
  this->fK = 1.0;
  this->fF = 1.0;
  this->fP = 0.0;
  this->fO = 0.0;
  iVar2 = strncmp(szOptions,"time_arg",8);
  __nptr = szOptions;
  if (iVar2 == 0) {
    __nptr = szOptions + 8;
    local_38 = __nptr;
    if (szOptions[8] != '\0') {
      iVar2 = isspace((int)szOptions[8]);
      __nptr = szOptions;
      if (iVar2 == 0) goto LAB_0010129c;
      __nptr = szOptions + 9;
    }
    this->bTime = true;
  }
LAB_0010129c:
  dVar1 = strtod(__nptr,&local_20);
  if (__nptr != local_20) {
    this->fK = dVar1;
  }
  dVar1 = strtod(local_20,&local_28);
  if (local_20 != local_28) {
    this->fF = dVar1;
  }
  dVar1 = strtod(local_28,&local_30);
  if (local_28 != local_30) {
    this->fP = dVar1;
  }
  dVar1 = strtod(local_30,&local_38);
  if (local_30 != local_38) {
    this->fO = dVar1;
  }
  return;
}

Assistant:

NaSineFunc::NaSineFunc (char* szOptions, NaVector& vInit)
  : bTime(false), fK(1.0), fF(1.0), fP(0.0), fO(0.0)
{
  const char	*szTime = "time_arg";
  char		*szK, *szF, *szP, *szO, *szRest;
  NaReal	fTest;

  if(!strncmp(szOptions, szTime, strlen(szTime)))
    {
      szRest = szOptions + strlen(szTime);
      if('\0' == *szRest) {
	szK = szRest;
	bTime = true;
      }
      else if(isspace(*szRest)) {
	szK = szRest + 1;
	bTime = true;
      }
      else
	szK = szOptions;
    }
  else
    szK = szOptions;

  fTest = strtod(szK, &szF);
  if(szK != szF)
    fK = fTest;

  fTest = strtod(szF, &szP);
  if(szF != szP)
    fF = fTest;

  fTest = strtod(szP, &szO);
  if(szP != szO)
    fP = fTest;

  fTest = strtod(szO, &szRest);
  if(szO != szRest)
    fO = fTest;
}